

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void SetActorAngle(AActor *activator,int tid,int angle,bool interpolate)

{
  AActor **ppAVar1;
  AActor *this;
  DAngle local_38;
  DAngle local_30;
  
  local_30.Degrees = (double)angle * 0.0054931640625;
  if (tid == 0) {
    if (activator != (AActor *)0x0) {
      AActor::SetAngle(activator,&local_30,interpolate);
    }
  }
  else {
    this = (AActor *)0x0;
    while( true ) {
      ppAVar1 = &this->inext;
      if (this == (AActor *)0x0) {
        ppAVar1 = (AActor **)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
      }
      for (this = *ppAVar1; (this != (AActor *)0x0 && (this->tid != tid)); this = this->inext) {
      }
      if (this == (AActor *)0x0) break;
      local_38.Degrees = local_30.Degrees;
      AActor::SetAngle(this,&local_38,interpolate);
    }
  }
  return;
}

Assistant:

inline DAngle ACSToAngle(int acsval)
{
	return acsval * (360. / 65536.);
}